

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.c
# Opt level: O2

int macro_getargs(int ip)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  ushort **ppuVar7;
  ulong uVar8;
  size_t sVar9;
  __int32_t **pp_Var10;
  char (*__src) [80];
  int iVar11;
  byte *pbVar12;
  int iVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  char (*pacVar19) [80];
  bool bVar20;
  
  lVar6 = (long)midx;
  if (lVar6 == 7) {
    pcVar14 = "Too many nested macro calls!";
  }
  else {
    mcntstack[lVar6] = mcounter;
    iVar11 = midx + 1;
    midx = iVar11;
    mstack[lVar6] = mlptr;
    for (lVar6 = 0; lVar6 != 0x2d0; lVar6 = lVar6 + 0x50) {
      marg[iVar11][0][lVar6] = '\0';
    }
    pacVar19 = marg[iVar11];
    ppuVar7 = __ctype_b_loc();
    iVar11 = 0;
LAB_0010d313:
    do {
      while( true ) {
        pcVar14 = prlnbuf + ip;
        iVar13 = ip;
        do {
          ip = ip + 1;
          iVar13 = iVar13 + 1;
          cVar4 = *pcVar14;
          uVar8 = (ulong)cVar4;
          pcVar14 = pcVar14 + 1;
        } while ((*(byte *)((long)*ppuVar7 + uVar8 * 2 + 1) & 0x20) != 0);
        lVar6 = (long)iVar13;
        if (cVar4 != '\\') break;
        pcVar14 = prlnbuf + ip;
        do {
          cVar4 = *pcVar14;
          pcVar14 = pcVar14 + 1;
        } while ((*(byte *)((long)*ppuVar7 + (long)cVar4 * 2 + 1) & 0x20) != 0);
        if ((cVar4 != '\0') && (cVar4 != ';')) {
LAB_0010d3c0:
          lVar15 = 0;
          iVar5 = 0;
          bVar3 = false;
          iVar13 = 0;
          do {
            lVar17 = (long)iVar5;
            cVar4 = (char)uVar8;
            if (cVar4 == '(') {
LAB_0010d405:
              iVar13 = iVar13 + 1;
LAB_0010d407:
              if (bVar3) {
                bVar3 = true;
                if (cVar4 != ' ') goto LAB_0010d427;
              }
              else {
                if (cVar4 != ' ') {
LAB_0010d449:
                  lVar16 = (long)iVar5;
                  goto LAB_0010d44c;
                }
                bVar3 = true;
              }
            }
            else {
              uVar18 = (uint)uVar8 & 0xff;
              if (uVar18 == 0x29) {
LAB_0010d3fc:
                bVar20 = iVar13 == 0;
                iVar13 = iVar13 + -1;
                if (bVar20) {
                  iVar13 = 0;
                }
                goto LAB_0010d407;
              }
              if (uVar18 != 0x2c) {
                if (uVar18 == 0x5b) goto LAB_0010d405;
                if (uVar18 == 0x5d) goto LAB_0010d3fc;
                if (((uVar8 & 0xff) != 0) && (uVar18 != 0x3b)) goto LAB_0010d407;
                goto LAB_0010d46e;
              }
              if (iVar13 == 0) goto LAB_0010d46e;
              if (!bVar3) goto LAB_0010d449;
LAB_0010d427:
              lVar16 = lVar17 << 0x20;
              for (; lVar17 < lVar15; lVar17 = lVar17 + 1) {
                (*(char (*) [80])*pacVar19)[lVar17] = ' ';
                lVar16 = lVar16 + 0x100000000;
              }
              lVar16 = lVar16 >> 0x20;
              iVar5 = (int)lVar17;
LAB_0010d44c:
              (*(char (*) [80])*pacVar19)[lVar16] = cVar4;
              iVar5 = iVar5 + 1;
              bVar3 = false;
              if (iVar5 == 0x50) goto LAB_0010d668;
            }
            lVar15 = lVar15 + 1;
            uVar8 = (ulong)(byte)prlnbuf[lVar6];
            lVar6 = lVar6 + 1;
          } while( true );
        }
        if (pass == 1) {
          println();
          clearln();
        }
        iVar13 = readline();
        ip = 0x1a;
        if (iVar13 == -1) {
          return 0;
        }
      }
      if (cVar4 == '\0') {
        return 1;
      }
      ip = iVar13;
      if (cVar4 == '\"') {
        (*(char (*) [80])*pacVar19)[0] = '\"';
        cVar4 = '\"';
        bVar3 = true;
        lVar6 = 1;
LAB_0010d58e:
        lVar17 = (long)iVar13;
        lVar15 = 0;
        while( true ) {
          iVar13 = iVar13 + 1;
          cVar1 = prlnbuf[lVar15 + lVar17];
          if (cVar1 == '\0') {
            pcVar14 = "Unterminated string!";
            goto LAB_0010d66f;
          }
          if (lVar6 + lVar15 == 0x50) {
            pcVar14 = "String too long, max. 80 characters!";
            goto LAB_0010d66f;
          }
          if (cVar1 == cVar4) break;
          (*(char (*) [80])*pacVar19)[lVar15 + lVar6] = cVar1;
          lVar15 = lVar15 + 1;
          ip = ip + 1;
        }
        if (bVar3) {
          iVar5 = (int)lVar6 + (int)lVar15 + 1;
          (*(char (*) [80])*pacVar19)[lVar6 + lVar15] = cVar4;
        }
        else {
          iVar5 = (int)lVar6 + (int)lVar15;
        }
        pbVar12 = (byte *)(prlnbuf + iVar13);
        do {
          bVar2 = *pbVar12;
          ip = ip + 1;
          pbVar12 = pbVar12 + 1;
        } while ((*(byte *)((long)*ppuVar7 + (long)(char)bVar2 * 2 + 1) & 0x20) != 0);
        if ((bVar2 < 0x3c) && ((0x800100000000001U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
          __src = (char (*) [80])(*(char (*) [80])*pacVar19 + iVar5);
          iVar13 = iVar11;
          goto LAB_0010d660;
        }
        pcVar14 = "Syntax error!";
        goto LAB_0010d66f;
      }
      if (cVar4 != ',') {
        if (cVar4 == ';') {
          return 1;
        }
        if (cVar4 != '{') goto LAB_0010d3c0;
        cVar4 = '}';
        bVar3 = false;
        lVar6 = 0;
        goto LAB_0010d58e;
      }
      iVar11 = iVar11 + 1;
      pacVar19 = marg[midx] + iVar11;
    } while (iVar11 != 9);
    pcVar14 = "Too many arguments for a macro!";
  }
LAB_0010d66f:
  error(pcVar14);
  return 0;
LAB_0010d46e:
  (*(char (*) [80])*pacVar19)[lVar17] = '\0';
  ip = (int)lVar6 + -1;
  sVar9 = strlen(*pacVar19);
  if (((sVar9 != 0 && iVar11 != 0) &&
      (pp_Var10 = __ctype_tolower_loc(),
      ((*pp_Var10)[(*(char (*) [80])*pacVar19)[0]] & 0xfeU) == 0x78)) &&
     ((iVar13 = strcasecmp(*pacVar19,"x++"), iVar13 == 0 ||
      ((iVar13 = strcasecmp(*pacVar19,"y++"), sVar9 == 1 || (iVar13 == 0)))))) {
    iVar13 = iVar11 + -1;
    lVar6 = (long)midx;
    pacVar19 = marg[lVar6] + iVar13;
    sVar9 = strlen(*pacVar19);
    if (0x4b < sVar9) {
LAB_0010d668:
      pcVar14 = "Macro argument string too long, max. 80 characters!";
      goto LAB_0010d66f;
    }
    sVar9 = strlen(*pacVar19);
    (*pacVar19 + sVar9)[0] = ',';
    (*pacVar19 + sVar9)[1] = '\0';
    __src = marg[lVar6] + iVar11;
    strcat(*pacVar19,*__src);
    pacVar19 = __src;
LAB_0010d660:
    (*(char (*) [80])*__src)[0] = '\0';
    iVar11 = iVar13;
  }
  goto LAB_0010d313;
}

Assistant:

int
macro_getargs(int ip)
{
	char *ptr;
	char  c, t;
	int   i, j, f, arg;
	int   level;

	/* can not nest too much macros */
	if (midx == 7) {
		error("Too many nested macro calls!");
		return (0);
	}

	/* initialize args */
	mcntstack[midx] = mcounter;
	mstack[midx++] = mlptr;
	ptr = marg[midx][0];
	arg = 0;

	for (i = 0; i < 9; i++)
		marg[midx][i][0] = '\0';

	/* extract args */
	for (;;) {
		/* skip spaces */
		while (isspace(prlnbuf[ip]))
			ip++;

		c = prlnbuf[ip++];
		switch (c) {
		/* no arg */
		case ',':
			arg++;
			ptr = marg[midx][arg];
			if (arg == 9) {
				error("Too many arguments for a macro!");
				return (0);
			}
			break;

		/* string */
		case '{':
			c = '}';
		case '\"':
			i = 0;
			if (c == '\"')
				ptr[i++] = c;
			for (;;) {
				t = prlnbuf[ip++];
				if (t == '\0') {
					error("Unterminated string!");
					return (0);
				}
				if (i == 80) {
					error("String too long, max. 80 characters!");
					return (0);
				}
				if (t == c)
					break;
				ptr[i++] = t;
			}
			if (c == '\"')
				ptr[i++] = t;

			/* skip spaces */
			while (isspace(prlnbuf[ip]))
				ip++;

			/* check end of arg */
			switch (prlnbuf[ip]) {
			case '\0':
			case ',':
			case ';':
				break;

			default:
				error("Syntax error!");
				return (0);
			}

			/* end arg string */
			ptr[i] = '\0';
			break;

		/* end of line */
		case ';':
		case '\0':
			return (1);

		/* continuation char */
		case '\\':
			/* skip spaces */
			i = ip;
			while (isspace(prlnbuf[i]))
				i++;

			/* check */
			if (prlnbuf[i] == ';' || prlnbuf[i] == '\0') {
				/* output line */
				if (pass == LAST_PASS) {
					println();
					clearln();
				}

				/* read a new line */
				if (readline() == -1)
					return (0);

				/* rewind line pointer and continue */
				ip = SFIELD;
				break;
			}

		/* other */
		default:
			i = 0;
			j = 0;
			f = 0;
			level = 0;
			while (c) {
				if (c == ',') {
					if (level == 0)
						break;
				}
				else if ((c == '(') || (c == '[')) {
					level++;
				}
				else if ((c == ')') || (c == ']')) {
					if (level)
						level--;
				}
				else if (c == ';') {
					break;
				}
				if (f) {
					if (c != ' ') {
						while (i < j)
							ptr[i++] = ' ';
						ptr[i++] = c;
						f = 0;
					}
				}
				else if (c == ' ') {
					f = 1;
				}
				else {
					ptr[i++] = c;
				}
				if (i == 80) {
					error("Macro argument string too long, max. 80 characters!");
					return (0);
				}
				j++;
				c = prlnbuf[ip++];
			}
			ptr[i] = '\0';
			ip--;

			/* check if arg is X or Y */
			if (strlen(ptr) && arg) {
				c = tolower(ptr[0]);

				if ((c == 'x') || (c == 'y')) {
					if ((strcasecmp(ptr, "x++") == 0) ||
						(strcasecmp(ptr, "y++") == 0) ||
						(strlen(ptr) == 1))
					{
						arg--;
						ptr = marg[midx][arg];

						/* check string length */
						if (strlen(ptr) > 75) {
							error("Macro argument string too long, max. 80 characters!");
							return (0);
						}

						/* attach current arg to the previous one */
						strcat(ptr, ",");
						strcat(ptr, marg[midx][arg + 1]);
						ptr = marg[midx][arg + 1];
						ptr[0] = '\0';
					}
			 	}
			}
			break;
		}
	}
}